

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbabus.c
# Opt level: O1

void tmcnth_write(int n,uint16_t old_value)

{
  byte bVar1;
  gbabus_t *pgVar2;
  int i;
  long lVar3;
  
  pgVar2 = bus;
  bus->TMSTART[n] = (_Bool)(*(byte *)(bus->TMCNT_H + n) >> 7);
  if ((-1 < (char)old_value) && (((uint)pgVar2->TMCNT_H[n] & 0x80) != 0)) {
    pgVar2->TMINT[n].ticks = 0;
    *(TMCNT_L_t *)(pgVar2->TMINT + n) = pgVar2->TMCNT_L[n];
  }
  pgVar2->num_active_timers = '\0';
  lVar3 = 0;
  do {
    pgVar2 = bus;
    if ((bus->TMCNT_H[lVar3].raw & 0x84) == 0x80) {
      bVar1 = bus->num_active_timers;
      bus->num_active_timers = bVar1 + 1;
      pgVar2->TMACTIVE[bVar1] = (uint8_t)lVar3;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  return;
}

Assistant:

void tmcnth_write(int n, half old_value) {
    TMCNT_H_t old;
    old.raw = old_value;
    bus->TMSTART[n] = bus->TMCNT_H[n].start;
    if (!old.start && bus->TMCNT_H[n].start) {
        bus->TMINT[n].ticks = 0;
        bus->TMINT[n].value = bus->TMCNT_L[n].timer_reload;
    }

    bus->num_active_timers = 0;
    for (int i = 0; i < 4; i++) {
        if (bus->TMCNT_H[i].start && !bus->TMCNT_H[i].cascade) {
            bus->TMACTIVE[bus->num_active_timers++] = i;
        }
    }
}